

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O3

bool __thiscall
glcts::anon_unknown_0::SACSubcaseBase::CheckMaxValue(SACSubcaseBase *this,GLenum e,GLint expected)

{
  bool bVar1;
  bool bVar2;
  SACSubcaseBase *this_00;
  bool bVar3;
  char *pcVar4;
  GLenum GVar5;
  CallLogWrapper *this_01;
  GLboolean b;
  GLfloat f;
  GLint i;
  GLint64 i64;
  GLboolean local_39;
  float local_38;
  uint local_34;
  uint local_30;
  undefined4 uStack_2c;
  
  this_00 = (SACSubcaseBase *)(ulong)e;
  this_01 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  GVar5 = e;
  glu::CallLogWrapper::glGetIntegerv(this_01,e,(GLint *)&local_34);
  pcVar4 = GLenumToString(this_00,GVar5);
  anon_unknown_0::Output("%s = %d\n",pcVar4,(ulong)local_34);
  bVar1 = expected <= (int)local_34;
  if ((int)local_34 < expected) {
    pcVar4 = GLenumToString(this_00,(GLenum)pcVar4);
    anon_unknown_0::Output
              ("%s state is incorrect (GetIntegerv, is: %d, expected: %d)\n",pcVar4,(ulong)local_34,
               (ulong)(uint)expected);
  }
  GVar5 = e;
  glu::CallLogWrapper::glGetInteger64v(this_01,e,(GLint64 *)&local_30);
  bVar2 = (long)(ulong)(uint)expected <= CONCAT44(uStack_2c,local_30);
  if (!bVar2) {
    pcVar4 = GLenumToString(this_00,GVar5);
    anon_unknown_0::Output
              ("%s state is incorrect (GetInteger64v, is: %d, expected: %d)\n",pcVar4,
               (ulong)local_30,(ulong)(uint)expected);
  }
  GVar5 = e;
  glu::CallLogWrapper::glGetFloatv(this_01,e,&local_38);
  bVar3 = (float)expected <= local_38;
  if (!bVar3) {
    pcVar4 = GLenumToString(this_00,GVar5);
    anon_unknown_0::Output
              ("%s state is incorrect (GetFloatv, is: %f, expected: %d)\n",(double)local_38,pcVar4,
               (ulong)(uint)expected);
  }
  glu::CallLogWrapper::glGetBooleanv(this_01,e,&local_39);
  return bVar3 && (bVar2 && bVar1);
}

Assistant:

bool CheckMaxValue(GLenum e, GLint expected)
	{
		bool ok = true;

		GLint i;
		glGetIntegerv(e, &i);
		Output("%s = %d\n", GLenumToString(e), i);
		if (i < expected)
		{
			ok = false;
			Output("%s state is incorrect (GetIntegerv, is: %d, expected: %d)\n", GLenumToString(e), i, expected);
		}

		GLint64 i64;
		glGetInteger64v(e, &i64);
		if (i64 < static_cast<GLint64>(expected))
		{
			ok = false;
			Output("%s state is incorrect (GetInteger64v, is: %d, expected: %d)\n", GLenumToString(e),
				   static_cast<GLint>(i64), expected);
		}

		GLfloat f;
		glGetFloatv(e, &f);
		if (f < static_cast<GLfloat>(expected))
		{
			ok = false;
			Output("%s state is incorrect (GetFloatv, is: %f, expected: %d)\n", GLenumToString(e), f, expected);
		}

		GLboolean b;
		glGetBooleanv(e, &b);

		return ok;
	}